

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticParser.h
# Opt level: O3

vector<pbrt::math::vec3i,_std::allocator<pbrt::math::vec3i>_> * __thiscall
pbrt::SemanticParser::extractVector<pbrt::math::vec3i>
          (vector<pbrt::math::vec3i,_std::allocator<pbrt::math::vec3i>_> *__return_storage_ptr__,
          SemanticParser *this,SP *shape,string *name)

{
  void *__src;
  ulong __new_size;
  ulong uVar1;
  SP param;
  long local_30;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_28;
  
  (__return_storage_ptr__->super__Vector_base<pbrt::math::vec3i,_std::allocator<pbrt::math::vec3i>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<pbrt::math::vec3i,_std::allocator<pbrt::math::vec3i>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<pbrt::math::vec3i,_std::allocator<pbrt::math::vec3i>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  syntactic::ParamSet::findParam<int>
            ((ParamSet *)&local_30,
             (string *)
             &(((shape->super___shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr)->super_Node).super_ParamSet);
  if (local_30 != 0) {
    __src = *(void **)(local_30 + 0x18);
    uVar1 = *(long *)(local_30 + 0x20) - (long)__src >> 2;
    __new_size = uVar1 / 3;
    std::vector<pbrt::math::vec3i,_std::allocator<pbrt::math::vec3i>_>::resize
              (__return_storage_ptr__,__new_size);
    if (2 < uVar1) {
      memmove((__return_storage_ptr__->
              super__Vector_base<pbrt::math::vec3i,_std::allocator<pbrt::math::vec3i>_>)._M_impl.
              super__Vector_impl_data._M_start,__src,__new_size * 0xc);
    }
  }
  if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<T> extractVector(pbrt::syntactic::Shape::SP shape, const std::string &name)
    {
      std::vector<T> result;
      typename ParamArray<typename T::scalar_t>::SP param = shape->findParam<typename T::scalar_t>(name);
      if (param) {

        int dims = sizeof(T)/sizeof(typename T::scalar_t);
        size_t num = param->size() / dims;// / T::dims;
        const T *const data = (const T*)param->data();
        
        result.resize(num);
        std::copy(data,data+num,result.begin());
      }
      return result;
    }